

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O1

SyntaxNode * __thiscall
slang::syntax::DeepCloneVisitor::visit<slang::syntax::DefaultNetTypeDirectiveSyntax>
          (DeepCloneVisitor *this,DefaultNetTypeDirectiveSyntax *node,BumpAllocator *alloc)

{
  DefaultNetTypeDirectiveSyntax *pDVar1;
  Token local_38;
  Token local_28;
  
  local_28 = parsing::Token::deepClone(&(node->super_DirectiveSyntax).directive,alloc);
  local_38 = parsing::Token::deepClone(&node->netType,alloc);
  pDVar1 = BumpAllocator::
           emplace<slang::syntax::DefaultNetTypeDirectiveSyntax,slang::parsing::Token,slang::parsing::Token>
                     (alloc,&local_28,&local_38);
  return (SyntaxNode *)pDVar1;
}

Assistant:

SyntaxNode* visit(const T& node, BumpAllocator& alloc) {
        return deep::clone(node, alloc);
    }